

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

void __thiscall
DigitalConsumer_python::DigitalConsumer_python
          (DigitalConsumer_python *this,HighFreqDataType *hf,int ringbufsize,
          HFParsingInfo *parseargs)

{
  allocator_type local_eb;
  value_type_conflict3 local_ea;
  HFParsingInfo local_e8;
  HighFreqDataType local_a8;
  
  HighFreqDataType::HighFreqDataType(&local_a8,hf);
  HFParsingInfo::HFParsingInfo(&local_e8,parseargs);
  DigitalConsumer::DigitalConsumer(&this->super_DigitalConsumer,&local_a8,ringbufsize,&local_e8);
  HFParsingInfo::~HFParsingInfo(&local_e8);
  HighFreqDataType::~HighFreqDataType(&local_a8);
  (this->super_wrapper<DigitalConsumer>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_DigitalConsumer).super_HFSubConsumer.super_HighFreqSub._vptr_HighFreqSub =
       (_func_int **)&PTR__DigitalConsumer_python_0043b3f0;
  local_ea = 0;
  std::vector<short,_std::allocator<short>_>::vector
            (&this->data,
             (ulong)((long)(parseargs->indices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(parseargs->indices).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2) >> 1,&local_ea,&local_eb);
  __Py_NoneStruct = __Py_NoneStruct + 1;
  (this->owner).super_object_base.m_ptr = (PyObject *)&_Py_NoneStruct;
  return;
}

Assistant:

DigitalConsumer_python(HighFreqDataType hf, int ringbufsize, HFParsingInfo parseargs)
        : DigitalConsumer(hf, ringbufsize, parseargs),
          data(parseargs.indices.size()/2, 0){}